

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall QuerySegment_Test2_Test::TestBody(QuerySegment_Test2_Test *this)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_00;
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string s2;
  string s1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  QuerySegment segment;
  string *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  int iVar3;
  allocator<char> *expected_expression;
  char *in_stack_fffffffffffffb80;
  allocator<char> *file;
  string *in_stack_fffffffffffffb88;
  Type type;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  undefined1 uVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  QuerySegment *in_stack_fffffffffffffba0;
  Message *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 uVar6;
  AssertionResult local_3f0;
  allocator<char> local_3d9;
  string local_3d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator<char> local_381;
  string local_380 [48];
  AssertionResult local_350;
  allocator<char> local_339;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator<char> local_2e1;
  string local_2e0 [36];
  uint local_2bc;
  AssertionResult local_2a8;
  allocator<char> local_291;
  string local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  undefined1 local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [55];
  allocator<char> local_159;
  string local_158 [344];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  cppjieba::QuerySegment::QuerySegment
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98._M_current,
             (string *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d8 + 0x1f));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1cb3ea);
  std::__cxx11::string::string(local_1f8);
  std::__cxx11::string::string(local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  cppjieba::QuerySegment::Cut
            ((QuerySegment *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
             in_stack_fffffffffffffb58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1cb454);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb58);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  _Var5._M_current._7_1_ = in_stack_fffffffffffffb97;
  _Var5._M_current._0_7_ = in_stack_fffffffffffffb90;
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffffb98,_Var5,in_stack_fffffffffffffb88);
  std::__cxx11::string::operator=(local_1f8,local_260);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::operator=(local_218,anon_var_dwarf_75fe5);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    in_stack_fffffffffffffbb8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1cb728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(char *)in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbc0),in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    testing::Message::~Message((Message *)0x1cb785);
  }
  local_2bc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cb7f3);
  if (local_2bc == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    cppjieba::QuerySegment::Cut
              ((QuerySegment *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1cb84e);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
    local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb58);
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar2,(char *)in_stack_fffffffffffffb98._M_current,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    end._M_current._7_1_ = in_stack_fffffffffffffb97;
    end._M_current._0_7_ = in_stack_fffffffffffffb90;
    limonp::
    Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffb98,end,in_stack_fffffffffffffb88);
    _Var5._M_current = &local_308;
    std::__cxx11::string::operator=(local_1f8,(string *)_Var5._M_current);
    std::__cxx11::string::~string((string *)_Var5._M_current);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::operator=(local_218,anon_var_dwarf_76009);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    iVar3 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    uVar4 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffb90));
      in_stack_fffffffffffffb88 =
           (string *)testing::AssertionResult::failure_message((AssertionResult *)0x1cba69);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb90),
                 (Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),in_stack_fffffffffffffb80,iVar3,
                 (char *)in_stack_fffffffffffffb70);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbc0),in_stack_fffffffffffffbb8
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      testing::Message::~Message((Message *)0x1cbac6);
    }
    local_2bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cbb34);
    if (local_2bc == 0) {
      file = &local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar2,(char *)_Var5._M_current,
                 (allocator<char> *)CONCAT17(uVar4,in_stack_fffffffffffffb90));
      cppjieba::QuerySegment::Cut
                ((QuerySegment *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1cbb8f);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator(&local_381);
      in_stack_fffffffffffffb70 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d8;
      local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb58);
      local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb58);
      expected_expression = &local_3d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar2,(char *)_Var5._M_current,
                 (allocator<char> *)CONCAT17(uVar4,in_stack_fffffffffffffb90));
      end_00._M_current._7_1_ = uVar4;
      end_00._M_current._0_7_ = in_stack_fffffffffffffb90;
      limonp::
      Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (_Var5,end_00,in_stack_fffffffffffffb88);
      type = (Type)((ulong)in_stack_fffffffffffffb88 >> 0x20);
      pbVar2 = &local_3a8;
      std::__cxx11::string::operator=(local_1f8,(string *)pbVar2);
      std::__cxx11::string::~string((string *)pbVar2);
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      std::__cxx11::string::operator=(local_218,anon_var_dwarf_7601f);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((char *)expected_expression,(char *)in_stack_fffffffffffffb70,pbVar2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      iVar3 = (int)((ulong)expected_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
      in_stack_fffffffffffffb67 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffb90));
        testing::AssertionResult::failure_message((AssertionResult *)0x1cbdaa);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb90),type,(char *)file,iVar3
                   ,(char *)in_stack_fffffffffffffb70);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbb8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        testing::Message::~Message((Message *)0x1cbe05);
      }
      local_2bc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cbe70);
      if (local_2bc == 0) {
        local_2bc = 0;
      }
    }
  }
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb70);
  cppjieba::QuerySegment::~QuerySegment
            ((QuerySegment *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  return;
}

Assistant:

TEST(QuerySegment, Test2) {
  QuerySegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", "../test/testdata/userdict.utf8|../test/testdata/userdict.english");
  vector<string> words;
  string s1, s2;

  {
    segment.Cut("小明硕士毕业于中国科学院计算所，后在日本京都大学深造", words);
    s1 = Join(words.begin(), words.end(), "/");
    s2 = "小明/硕士/毕业/于/中国/科学/学院/科学院/中国科学院/计算/计算所/，/后/在/日本/京都/大学/京都大学/深造";
    ASSERT_EQ(s1, s2);
  }

  {
    segment.Cut("小明硕士毕业于中国科学院计算所iPhone6", words);
    s1 = Join(words.begin(), words.end(), "/");
    s2 = "小明/硕士/毕业/于/中国/科学/学院/科学院/中国科学院/计算/计算所/iPhone6";
    ASSERT_EQ(s1, s2);
  }

  {
    segment.Cut("中国科学院", words);
    s1 = Join(words.begin(), words.end(), "/");
    s2 = "中国/科学/学院/科学院/中国科学院";
    ASSERT_EQ(s1, s2);
  }

}